

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

timespec cm_tspecdiff(timespec time1,timespec time0)

{
  timespec tVar1;
  int iVar2;
  long lVar3;
  int sign;
  int xsec;
  timespec time0_local;
  timespec time1_local;
  timespec ret;
  
  time0_local.tv_nsec = time0.tv_nsec;
  time0_local.tv_sec = time0.tv_sec;
  lVar3 = time1.tv_nsec;
  sign = 1;
  if (lVar3 < time0_local.tv_nsec) {
    iVar2 = (int)((double)(time0_local.tv_nsec - lVar3) / 1000000001.0);
    time0_local.tv_nsec = time0_local.tv_nsec - (long)((double)iVar2 * 1000000000.0);
    time0_local.tv_sec = iVar2 + time0_local.tv_sec;
  }
  if (1000000000.0 < (double)(lVar3 - time0_local.tv_nsec)) {
    iVar2 = (int)((double)(lVar3 - time0_local.tv_nsec) / 1000000000.0);
    time0_local.tv_nsec = (long)((double)iVar2 * 1000000000.0) + time0_local.tv_nsec;
    time0_local.tv_sec = time0_local.tv_sec - iVar2;
  }
  if (time1.tv_sec < time0_local.tv_sec) {
    sign = -1;
  }
  tVar1.tv_nsec = lVar3 - time0_local.tv_nsec;
  tVar1.tv_sec = (time1.tv_sec - time0_local.tv_sec) * (long)sign;
  return tVar1;
}

Assistant:

static struct timespec cm_tspecdiff(struct timespec time1,
                                    struct timespec time0)
{
    struct timespec ret;
    int xsec = 0;
    int sign = 1;

    if (time0.tv_nsec > time1.tv_nsec) {
        xsec = (int) ((time0.tv_nsec - time1.tv_nsec) / (1E9 + 1));
        time0.tv_nsec -= (long int) (1E9 * xsec);
        time0.tv_sec += xsec;
    }

    if ((time1.tv_nsec - time0.tv_nsec) > 1E9) {
        xsec = (int) ((time1.tv_nsec - time0.tv_nsec) / 1E9);
        time0.tv_nsec += (long int) (1E9 * xsec);
        time0.tv_sec -= xsec;
    }

    ret.tv_sec = time1.tv_sec - time0.tv_sec;
    ret.tv_nsec = time1.tv_nsec - time0.tv_nsec;

    if (time1.tv_sec < time0.tv_sec) {
        sign = -1;
    }

    ret.tv_sec = ret.tv_sec * sign;

    return ret;
}